

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::transmitDelayedMessages(CommonCore *this,GlobalFederateId source)

{
  SimpleQueue<helics::ActionMessage,_std::mutex> *this_00;
  map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  *this_01;
  pointer pAVar1;
  ActionMessage *pAVar2;
  mapped_type *pmVar3;
  iterator __begin2;
  ActionMessage *val;
  pointer pAVar4;
  pointer this_02;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> buffer;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> local_1c8;
  _Optional_payload_base<helics::ActionMessage> local_1b0;
  _Storage<helics::ActionMessage,_false> local_f0;
  char local_38;
  
  local_1c8.super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
  _M_impl.super__Vector_impl_data._M_start = (ActionMessage *)0x0;
  local_1c8.super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (ActionMessage *)0x0;
  local_1c8.super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->delayTransmitQueue;
  gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
            ((optional<helics::ActionMessage> *)&local_1b0,this_00);
  val = local_1c8.super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pAVar2 = local_1c8.
           super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (local_1b0._M_engaged == true) {
    do {
      if (local_1b0._M_payload._M_value.source_id.gid == (GlobalFederateId)source.gid) {
        routeMessage(this,(ActionMessage *)&local_1b0);
      }
      else {
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
        emplace_back<helics::ActionMessage>(&local_1c8,(ActionMessage *)&local_1b0);
      }
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::pop
                ((optional<helics::ActionMessage> *)&local_f0._M_value,this_00);
      std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
                (&local_1b0,(_Optional_payload_base<helics::ActionMessage> *)&local_f0._M_value);
      if (local_38 == '\x01') {
        local_38 = '\0';
        ActionMessage::~ActionMessage(&local_f0._M_value);
      }
      val = local_1c8.
            super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
            _M_impl.super__Vector_impl_data._M_start;
      pAVar2 = local_1c8.
               super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    } while (local_1b0._M_engaged != false);
  }
  for (; val != pAVar2; val = val + 1) {
    gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
              (this_00,val);
  }
  this_01 = &this->delayedTimingMessages;
  local_f0._M_value.messageAction = source.gid;
  pmVar3 = std::
           map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
           ::operator[](this_01,(key_type *)&local_f0);
  if ((pmVar3->super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pmVar3->super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_f0._M_value.messageAction = source.gid;
    pmVar3 = std::
             map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
             ::operator[](this_01,(key_type *)&local_f0);
    pAVar1 = (pmVar3->
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pAVar4 = (pmVar3->
                  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>)
                  ._M_impl.super__Vector_impl_data._M_start; pAVar4 != pAVar1; pAVar4 = pAVar4 + 1)
    {
      routeMessage(this,pAVar4);
    }
    local_f0._M_value.messageAction = source.gid;
    pmVar3 = std::
             map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
             ::operator[](this_01,(key_type *)&local_f0);
    pAVar4 = (pmVar3->
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pAVar1 = (pmVar3->
             super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    this_02 = pAVar4;
    if (pAVar1 != pAVar4) {
      do {
        ActionMessage::~ActionMessage(this_02);
        this_02 = this_02 + 1;
      } while (this_02 != pAVar1);
      (pmVar3->super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>).
      _M_impl.super__Vector_impl_data._M_finish = pAVar4;
    }
  }
  if (local_1b0._M_engaged == true) {
    local_1b0._M_engaged = false;
    ActionMessage::~ActionMessage((ActionMessage *)&local_1b0);
  }
  std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector(&local_1c8);
  return;
}

Assistant:

void CommonCore::transmitDelayedMessages(GlobalFederateId source)
{
    std::vector<ActionMessage> buffer;
    auto msg = delayTransmitQueue.pop();
    while (msg) {
        if (msg->source_id == source) {
            routeMessage(*msg);
        } else {  // these messages were delayed for a different purpose and will be dealt with in a
                  // different way
            buffer.push_back(std::move(*msg));
        }
        msg = delayTransmitQueue.pop();
    }

    if (!buffer.empty()) {
        for (auto& message : buffer) {
            delayTransmitQueue.push(std::move(message));
        }
    }

    if (!delayedTimingMessages[source.baseValue()].empty()) {
        for (auto& delayedMsg : delayedTimingMessages[source.baseValue()]) {
            routeMessage(delayedMsg);
        }
        delayedTimingMessages[source.baseValue()].clear();
    }
}